

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

NodePtr __thiscall dh::analysis::assignment_expr(analysis *this)

{
  undefined8 this_00;
  undefined8 uVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  analysis *in_RSI;
  NodePtr NVar6;
  NodePtr tmp_in_ptr;
  NodePtr tmp_cur_ptr;
  int local_e0;
  undefined1 local_d9;
  undefined1 local_d8 [40];
  element_type *local_b0;
  NodePtr local_a8;
  TreeNode *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  analysis *local_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cond_or_expr((analysis *)&local_a8);
  token::getVal_abi_cxx11_
            ((string *)local_d8,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar4 = std::__cxx11::string::compare(local_d8);
  _Var5._M_pi = extraout_RDX;
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_);
    _Var5._M_pi = extraout_RDX_00;
  }
  if (iVar4 == 0) {
    iVar4 = token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    local_90 = (TreeNode *)CONCAT44(local_90._4_4_,iVar4);
    local_d8._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[2],int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(TreeNode **)local_d8,
               (allocator<dh::TreeNode> *)&local_e0,(char (*) [2])0x12a29c,(int *)&local_90);
    uVar1 = local_d8._8_8_;
    this_00 = local_d8._0_8_;
    local_40._M_allocated_capacity._0_2_ = 0x3d;
    local_50._8_8_ = (element_type *)0x1;
    local_b0 = (element_type *)local_d8._8_8_;
    local_50._M_allocated_capacity = (size_type)&local_40;
    match(in_RSI,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_allocated_capacity != &local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
    local_d8._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)this_00,(int *)local_d8);
    local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
    TreeNode::setKind((TreeNode *)this_00,(int *)local_d8);
    TreeNode::appendChild((TreeNode *)this_00,&local_a8);
    local_90 = (TreeNode *)this_00;
    local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
    if ((element_type *)uVar1 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((shared_ptr<dh::symTab> *)(uVar1 + 8))->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)(uVar1 + 8))->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((shared_ptr<dh::symTab> *)(uVar1 + 8))->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)(uVar1 + 8))->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
    local_78 = this;
    while( true ) {
      cond_or_expr((analysis *)local_d8);
      _Var5._M_pi = local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8._0_8_;
      local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      if ((element_type *)_Var5._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
      }
      token::getVal_abi_cxx11_
                ((string *)local_d8,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar4 = std::__cxx11::string::compare((char *)local_d8);
      if ((TreeNode *)local_d8._0_8_ != (TreeNode *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
      if (iVar4 != 0) break;
      local_e0 = token::getLineno((in_RSI->tmp).
                                  super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_d8._0_8_ = (TreeNode *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[2],int>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(TreeNode **)local_d8,
                 (allocator<dh::TreeNode> *)&local_d9,(char (*) [2])0x12a29c,&local_e0);
      local_70.field_2._M_allocated_capacity._0_2_ = 0x3d;
      local_70._M_string_length = 1;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      match(in_RSI,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_e0 = 1;
      TreeNode::setNodeKind((TreeNode *)local_d8._0_8_,&local_e0);
      local_e0 = 0;
      TreeNode::setKind((TreeNode *)local_d8._0_8_,&local_e0);
      TreeNode::appendChild((TreeNode *)local_d8._0_8_,&local_a8);
      TreeNode::appendChild(local_90,(NodePtr *)local_d8);
      local_90 = (TreeNode *)local_d8._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_88,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
      if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
    }
    TreeNode::appendChild(local_90,&local_a8);
    this = local_78;
    _Var3._M_pi = local_80._M_pi;
    peVar2 = local_b0;
    _Var5._M_pi = extraout_RDX_01;
    if ((element_type *)local_88._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
      _Var5._M_pi = extraout_RDX_02;
    }
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = _Var3._M_pi;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    if ((element_type *)
        local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var5._M_pi = extraout_RDX_03;
    }
  }
  else {
    *(element_type **)this =
         local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi
  ;
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::assignment_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in assignment_expr\n";
#endif
	
	NodePtr ret;
	NodePtr tmp_ptr = cond_or_expr();

	if ( tmp->getVal() == "=")
	{
		ret = ::std::make_shared<TreeNode>("=",tmp->getLineno());
		match("=");
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::AssignK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = cond_or_expr();

			if ( tmp->getVal() == "=")
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>("=",tmp->getLineno());
				match("=");
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::AssignK);
				tmp_in_ptr->appendChild(tmp_ptr);

				tmp_cur_ptr->appendChild(tmp_in_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				tmp_cur_ptr->appendChild(tmp_ptr);
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}